

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O3

void interp1(double *x,double *y,int x_length,double *xi,int xi_length,double *yi)

{
  size_t __n;
  double dVar1;
  void *pvVar2;
  int *index;
  long lVar3;
  int i;
  ulong uVar4;
  double dVar5;
  
  uVar4 = (ulong)(x_length - 1) * 8;
  if (x_length < 1) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar2 = operator_new__(uVar4);
  __n = (ulong)(uint)xi_length * 4;
  uVar4 = 0xffffffffffffffff;
  if (-1 < xi_length) {
    uVar4 = __n;
  }
  index = (int *)operator_new__(uVar4);
  if (1 < x_length) {
    uVar4 = 0;
    dVar5 = *x;
    do {
      dVar1 = x[uVar4 + 1];
      *(double *)((long)pvVar2 + uVar4 * 8) = dVar1 - dVar5;
      uVar4 = uVar4 + 1;
      dVar5 = dVar1;
    } while (x_length - 1 != uVar4);
  }
  if (xi_length < 1) {
    histc(x,x_length,xi,xi_length,index);
  }
  else {
    uVar4 = 0;
    memset(index,0,__n);
    histc(x,x_length,xi,xi_length,index);
    do {
      lVar3 = (long)index[uVar4];
      yi[uVar4] = (y[lVar3] - y[lVar3 + -1]) *
                  ((xi[uVar4] - x[lVar3 + -1]) / *(double *)((long)pvVar2 + lVar3 * 8 + -8)) +
                  y[lVar3 + -1];
      uVar4 = uVar4 + 1;
    } while ((uint)xi_length != uVar4);
  }
  operator_delete__(index);
  operator_delete__(pvVar2);
  return;
}

Assistant:

void interp1(const double *x, const double *y, int x_length, const double *xi,
    int xi_length, double *yi) {
  double *h = new double[x_length - 1];
  int *k = new int[xi_length];

  for (int i = 0; i < x_length - 1; ++i) h[i] = x[i + 1] - x[i];
  for (int i = 0; i < xi_length; ++i) {
    k[i] = 0;
  }

  histc(x, x_length, xi, xi_length, k);

  for (int i = 0; i < xi_length; ++i) {
    double s = (xi[i] - x[k[i] - 1]) / h[k[i] - 1];
    yi[i] = y[k[i] - 1] + s * (y[k[i]] - y[k[i] - 1]);
  }
  
  delete[] k;
  delete[] h;
}